

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateParsingCode
          (RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  RepeatedImmutableStringFieldLiteGenerator *this_local;
  
  bVar1 = CheckUtf8(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"String s = input.readStringRequireUtf8();\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,"String s = input.readString();\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "if (!$is_mutable$) {\n  $name$_ =\n      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n}\n"
                    );
  io::Printer::Print(printer,&this->variables_,"$name$_.add(s);\n");
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
    "String s = input.readStringRequireUtf8();\n");
  } else {
    // Lite runtime should attempt to reduce allocations by attempting to
    // construct the string directly from the input stream buffer. This avoids
    // spurious intermediary ByteString allocations, cutting overall allocations
    // in half.
    printer->Print(variables_,
    "String s = input.readString();\n");
  }
  printer->Print(variables_,
    "if (!$is_mutable$) {\n"
    "  $name$_ =\n"
    "      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "}\n");
  printer->Print(variables_,
    "$name$_.add(s);\n");
}